

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

bool __thiscall
cmServerProtocol1::DoActivate(cmServerProtocol1 *this,cmServerRequest *request,string *errorMessage)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *this_00;
  cmState *state;
  pointer __last;
  bool bVar2;
  Value *pVVar3;
  undefined8 *puVar4;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  _Var5;
  long *plVar6;
  size_type *psVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  Value *this_01;
  long lVar10;
  string *psVar11;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  __it;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  __it_00;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  _Var12;
  anon_class_16_2_b7cf16a7_for__M_pred __pred;
  string cachePath;
  string buildDirectory;
  string sourceDirectory;
  string generator;
  string extraGenerator;
  string platform;
  string toolset;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generators;
  string local_300;
  string local_2e0;
  string *local_2c0;
  GeneratorInfo *local_2b8;
  GeneratorInformation local_2b0;
  cmServerProtocol1 *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string local_1c8;
  string local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string local_c8;
  string local_a8;
  string local_88;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = &request->Data;
  local_1f0 = this;
  pVVar3 = Json::Value::operator[](this_01,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_1a8,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_1c8,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kGENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_108,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_c8,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kTOOLSET_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_88,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kPLATFORM_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_a8,pVVar3);
  if (local_1a8._M_string_length != 0) {
    cmsys::SystemTools::CollapseFullPath(&local_2b0.GeneratorName,&local_1a8);
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2) {
      operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                      local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&local_1a8);
  }
  if (local_1c8._M_string_length != 0) {
    cmsys::SystemTools::CollapseFullPath(&local_2b0.GeneratorName,&local_1c8);
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2) {
      operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                      local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&local_1c8);
  }
  if (local_1c8._M_string_length == 0) {
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\"","");
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_2e0,
                                (ulong)kBUILD_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_300.field_2._M_allocated_capacity = *psVar7;
      local_300.field_2._8_8_ = plVar6[3];
    }
    else {
      local_300.field_2._M_allocated_capacity = *psVar7;
      local_300._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_300._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
      local_2b0.GeneratorName.field_2._8_8_ = plVar6[3];
    }
    else {
      local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
      local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_2b0.GeneratorName._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (errorMessage != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)errorMessage);
    }
    goto LAB_001489bb;
  }
  this_00 = (local_1f0->super_cmServerProtocol).m_CMakeInstance._M_t.
            super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
            super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
            super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  bVar2 = cmsys::SystemTools::PathExists(&local_1c8);
  if (bVar2) {
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_1c8);
    if (!bVar2) {
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\"","");
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_2e0,(ulong)kBUILD_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p
                         );
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      psVar7 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_300.field_2._M_allocated_capacity = *psVar7;
        local_300.field_2._8_8_ = puVar4[3];
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar7;
        local_300._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_300._M_string_length = puVar4[1];
      *puVar4 = psVar7;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
      local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
        local_2b0.GeneratorName.field_2._8_8_ = plVar6[3];
      }
      else {
        local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
        local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2b0.GeneratorName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (errorMessage != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)errorMessage);
      }
      goto LAB_001489bb;
    }
    cmake::FindCacheFile(&local_2b0.GeneratorName,&local_1c8);
    bVar2 = cmake::LoadCache(this_00,&local_2b0.GeneratorName);
    if (!bVar2) {
LAB_00148314:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2) {
        operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                        local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0014832f;
    }
    state = this_00->State;
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"CMAKE_GENERATOR","");
    paVar1 = &local_2e0.field_2;
    local_2e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"generator","");
    bVar2 = getOrTestValue(state,&local_300,&local_108,&local_2e0,errorMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_300,"CMAKE_EXTRA_GENERATOR","");
      local_2e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"extra generator","");
      bVar2 = getOrTestValue(state,&local_300,&local_c8,&local_2e0,errorMessage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((bVar2) && (bVar2 = getOrTestHomeDirectory(state,&local_1a8,errorMessage), bVar2)) {
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_300,"CMAKE_GENERATOR_TOOLSET","");
        local_2e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"toolset","");
        bVar2 = getOrTestValue(state,&local_300,&local_88,&local_2e0,errorMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_300,"CMAKE_GENERATOR_PLATFORM","");
          local_2e0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"platform","");
          bVar2 = getOrTestValue(state,&local_300,&local_a8,&local_2e0,errorMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) goto LAB_00148314;
        }
      }
    }
    uVar8 = local_2b0.GeneratorName.field_2._M_allocated_capacity;
    _Var9._M_p = local_2b0.GeneratorName._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2)
    goto LAB_001489f8;
  }
  else {
LAB_0014832f:
    if (local_1a8._M_string_length == 0) {
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\"","");
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_2e0,
                          (ulong)kSOURCE_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      psVar7 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_300.field_2._M_allocated_capacity = *psVar7;
        local_300.field_2._8_8_ = puVar4[3];
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar7;
        local_300._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_300._M_string_length = puVar4[1];
      *puVar4 = psVar7;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
      local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
        local_2b0.GeneratorName.field_2._8_8_ = plVar6[3];
      }
      else {
        local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
        local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2b0.GeneratorName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (errorMessage != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)errorMessage);
      }
    }
    else {
      bVar2 = cmsys::SystemTools::FileIsDirectory(&local_1a8);
      if (bVar2) {
        if (local_108._M_string_length != 0) {
          local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (GeneratorInfo *)0x0;
          local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (GeneratorInfo *)0x0;
          local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2c0 = errorMessage;
          cmake::GetRegisteredGenerators(this_00,&local_68,true);
          __last = local_68.
                   super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          lVar10 = ((long)local_68.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_68.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3 >> 2
          ;
          _Var5._M_current =
               local_68.
               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
          __it_00._M_current =
               local_68.
               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_108;
          if (0 < lVar10) {
            __it_00._M_current =
                 local_68.
                 super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar10 * 4;
            lVar10 = lVar10 + 1;
            local_2b8 = local_68.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            __it._M_current =
                 local_68.
                 super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            do {
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                    *)&local_2b0,__it);
              psVar11 = local_2c0;
              _Var5._M_current = local_2b8;
              _Var12._M_current = __it._M_current;
              if (bVar2) goto LAB_00148b06;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                    *)&local_2b0,__it._M_current + 1);
              psVar11 = local_2c0;
              _Var5._M_current = local_2b8;
              _Var12._M_current = __it._M_current + 1;
              if (bVar2) goto LAB_00148b06;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                    *)&local_2b0,__it._M_current + 2);
              psVar11 = local_2c0;
              _Var5._M_current = local_2b8;
              _Var12._M_current = __it._M_current + 2;
              if (bVar2) goto LAB_00148b06;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                    *)&local_2b0,__it._M_current + 3);
              psVar11 = local_2c0;
              _Var5._M_current = local_2b8;
              _Var12._M_current = __it._M_current + 3;
              if (bVar2) goto LAB_00148b06;
              __it._M_current = __it._M_current + 4;
              lVar10 = lVar10 + -1;
            } while (1 < lVar10);
          }
          psVar11 = local_2c0;
          lVar10 = ((long)__last - (long)__it_00._M_current >> 3) * -0x30c30c30c30c30c3;
          if (lVar10 == 1) {
LAB_00148af0:
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                  *)&local_2b0,__it_00);
            _Var12._M_current = __it_00._M_current;
            if (!bVar2) {
              _Var12._M_current = __last;
            }
          }
          else if (lVar10 == 2) {
LAB_001484aa:
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                  *)&local_2b0,__it_00);
            _Var12._M_current = __it_00._M_current;
            if (!bVar2) {
              __it_00._M_current = __it_00._M_current + 1;
              goto LAB_00148af0;
            }
          }
          else {
            _Var12._M_current = __last;
            if ((lVar10 == 3) &&
               (bVar2 = __gnu_cxx::__ops::
                        _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                        ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                      *)&local_2b0,__it_00), _Var12._M_current = __it_00._M_current,
               !bVar2)) {
              __it_00._M_current = __it_00._M_current + 1;
              goto LAB_001484aa;
            }
          }
LAB_00148b06:
          if (_Var12._M_current == __last) {
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"Generator \"","");
            std::operator+(&local_300,&local_2e0,&local_108);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
            paVar1 = &local_2b0.GeneratorName.field_2;
            psVar7 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
              local_2b0.GeneratorName.field_2._8_8_ = plVar6[3];
              local_2b0.GeneratorName._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
              local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_2b0.GeneratorName._M_string_length = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if (psVar11 != (string *)0x0) {
              std::__cxx11::string::_M_assign((string *)psVar11);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0.GeneratorName._M_dataplus._M_p != paVar1) {
              operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                              local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1
                             );
            }
            local_50.field_2._M_allocated_capacity = local_2e0.field_2._M_allocated_capacity;
            local_50._M_dataplus._M_p = local_2e0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p == &local_2e0.field_2) goto LAB_00148f82;
LAB_00148f7a:
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_00148f82:
            bVar2 = false;
          }
          else {
            __pred.extraGenerator = &local_c8;
            __pred.generator = &local_108;
            _Var5 = std::
                    find_if<__gnu_cxx::__normal_iterator<cmake::GeneratorInfo*,std::vector<cmake::GeneratorInfo,std::allocator<cmake::GeneratorInfo>>>,cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                              (_Var5,(__normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                                      )__last,__pred);
            if (_Var5._M_current == __last) {
              std::operator+(&local_50,"The combination of generator \"",&local_108);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
              psVar7 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_2e0.field_2._M_allocated_capacity = *psVar7;
                local_2e0.field_2._8_8_ = plVar6[3];
                local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
              }
              else {
                local_2e0.field_2._M_allocated_capacity = *psVar7;
                local_2e0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_2e0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::operator+(&local_300,&local_2e0,&local_c8);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
              paVar1 = &local_2b0.GeneratorName.field_2;
              psVar7 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
                local_2b0.GeneratorName.field_2._8_8_ = plVar6[3];
                local_2b0.GeneratorName._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
                local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_2b0.GeneratorName._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if (psVar11 != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)psVar11);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0.GeneratorName._M_dataplus._M_p != paVar1) {
                operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                                local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                operator_delete(local_300._M_dataplus._M_p,
                                local_300.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p,
                                local_2e0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00148f7a;
              goto LAB_00148f82;
            }
            if (((_Var5._M_current)->supportsToolset == false) && (local_88._M_string_length != 0))
            {
              local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2b0,
                         "Toolset was provided but is not supported by the requested generator.","")
              ;
              if (psVar11 != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)psVar11);
              }
LAB_00148ca5:
              local_50.field_2._M_allocated_capacity =
                   local_2b0.GeneratorName.field_2._M_allocated_capacity;
              local_50._M_dataplus._M_p = local_2b0.GeneratorName._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2)
              goto LAB_00148f7a;
              goto LAB_00148f82;
            }
            if (((_Var5._M_current)->supportsPlatform == false) && (local_a8._M_string_length != 0))
            {
              local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2b0,
                         "Platform was provided but is not supported by the requested generator.",""
                        );
              if (psVar11 != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)psVar11);
              }
              goto LAB_00148ca5;
            }
            local_1e8 = &local_1d8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1e8,local_108._M_dataplus._M_p,
                       local_108._M_dataplus._M_p + local_108._M_string_length);
            local_128 = &local_118;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,local_c8._M_dataplus._M_p,
                       local_c8._M_dataplus._M_p + local_c8._M_string_length);
            local_148 = &local_138;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,local_88._M_dataplus._M_p,
                       local_88._M_dataplus._M_p + local_88._M_string_length);
            local_168 = &local_158;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_168,local_a8._M_dataplus._M_p,
                       local_a8._M_dataplus._M_p + local_a8._M_string_length);
            local_188 = &local_178;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_188,local_1a8._M_dataplus._M_p,
                       local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
            local_e8 = &local_d8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,local_1c8._M_dataplus._M_p,
                       local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
            local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
            if (local_1e8 == &local_1d8) {
              local_2b0.GeneratorName.field_2._8_8_ = local_1d8._8_8_;
            }
            else {
              local_2b0.GeneratorName._M_dataplus._M_p = (pointer)local_1e8;
            }
            local_2b0.GeneratorName.field_2._M_allocated_capacity._1_7_ =
                 local_1d8._M_allocated_capacity._1_7_;
            local_2b0.GeneratorName.field_2._M_local_buf[0] = local_1d8._M_local_buf[0];
            local_2b0.ExtraGeneratorName._M_dataplus._M_p =
                 (pointer)&local_2b0.ExtraGeneratorName.field_2;
            local_2b0.GeneratorName._M_string_length = local_1e0;
            local_1e0 = 0;
            local_1d8._M_local_buf[0] = '\0';
            if (local_128 == &local_118) {
              local_2b0.ExtraGeneratorName.field_2._8_8_ = local_118._8_8_;
            }
            else {
              local_2b0.ExtraGeneratorName._M_dataplus._M_p = (pointer)local_128;
            }
            local_2b0.Toolset._M_dataplus._M_p = (pointer)&local_2b0.Toolset.field_2;
            local_2b0.ExtraGeneratorName._M_string_length = local_120;
            local_120 = 0;
            local_118._M_local_buf[0] = '\0';
            if (local_148 == &local_138) {
              local_2b0.Toolset.field_2._8_8_ = local_138._8_8_;
            }
            else {
              local_2b0.Toolset._M_dataplus._M_p = (pointer)local_148;
            }
            local_2b0.Platform._M_dataplus._M_p = (pointer)&local_2b0.Platform.field_2;
            local_2b0.Toolset._M_string_length = local_140;
            local_140 = 0;
            local_138._M_local_buf[0] = '\0';
            if (local_168 == &local_158) {
              local_2b0.Platform.field_2._8_8_ = local_158._8_8_;
            }
            else {
              local_2b0.Platform._M_dataplus._M_p = (pointer)local_168;
            }
            local_2b0.SourceDirectory._M_dataplus._M_p = (pointer)&local_2b0.SourceDirectory.field_2
            ;
            local_2b0.Platform._M_string_length = local_160;
            local_160 = 0;
            local_158._M_local_buf[0] = '\0';
            if (local_188 == &local_178) {
              local_2b0.SourceDirectory.field_2._8_8_ = local_178._8_8_;
            }
            else {
              local_2b0.SourceDirectory._M_dataplus._M_p = (pointer)local_188;
            }
            local_2b0.BuildDirectory._M_dataplus._M_p = (pointer)&local_2b0.BuildDirectory.field_2;
            local_2b0.SourceDirectory._M_string_length = local_180;
            local_180 = 0;
            local_178._M_local_buf[0] = '\0';
            if (local_e8 == &local_d8) {
              local_2b0.BuildDirectory.field_2._8_8_ = local_d8._8_8_;
            }
            else {
              local_2b0.BuildDirectory._M_dataplus._M_p = (pointer)local_e8;
            }
            local_2b0.BuildDirectory._M_string_length = local_e0;
            local_e0 = 0;
            local_d8._M_local_buf[0] = '\0';
            local_1e8 = &local_1d8;
            local_188 = &local_178;
            local_168 = &local_158;
            local_148 = &local_138;
            local_128 = &local_118;
            local_e8 = &local_d8;
            GeneratorInformation::operator=(&local_1f0->GeneratorInfo,&local_2b0);
            GeneratorInformation::~GeneratorInformation(&local_2b0);
            if (local_e8 != &local_d8) {
              operator_delete(local_e8,CONCAT71(local_d8._M_allocated_capacity._1_7_,
                                                local_d8._M_local_buf[0]) + 1);
            }
            if (local_188 != &local_178) {
              operator_delete(local_188,
                              CONCAT71(local_178._M_allocated_capacity._1_7_,
                                       local_178._M_local_buf[0]) + 1);
            }
            if (local_168 != &local_158) {
              operator_delete(local_168,
                              CONCAT71(local_158._M_allocated_capacity._1_7_,
                                       local_158._M_local_buf[0]) + 1);
            }
            if (local_148 != &local_138) {
              operator_delete(local_148,
                              CONCAT71(local_138._M_allocated_capacity._1_7_,
                                       local_138._M_local_buf[0]) + 1);
            }
            if (local_128 != &local_118) {
              operator_delete(local_128,
                              CONCAT71(local_118._M_allocated_capacity._1_7_,
                                       local_118._M_local_buf[0]) + 1);
            }
            if (local_1e8 != &local_1d8) {
              operator_delete(local_1e8,
                              CONCAT71(local_1d8._M_allocated_capacity._1_7_,
                                       local_1d8._M_local_buf[0]) + 1);
            }
            local_1f0->m_State = STATE_ACTIVE;
            bVar2 = true;
          }
          std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
                    (&local_68);
          goto LAB_00148a02;
        }
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\"","");
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2e0,(ulong)kGENERATOR_KEY_abi_cxx11_._M_dataplus._M_p);
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        psVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_300.field_2._M_allocated_capacity = *psVar7;
          local_300.field_2._8_8_ = puVar4[3];
        }
        else {
          local_300.field_2._M_allocated_capacity = *psVar7;
          local_300._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_300._M_string_length = puVar4[1];
        *puVar4 = psVar7;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
        local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
          local_2b0.GeneratorName.field_2._8_8_ = plVar6[3];
        }
        else {
          local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
          local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2b0.GeneratorName._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (errorMessage != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)errorMessage);
        }
      }
      else {
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\"","");
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2e0,
                            (ulong)kSOURCE_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        psVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_300.field_2._M_allocated_capacity = *psVar7;
          local_300.field_2._8_8_ = puVar4[3];
        }
        else {
          local_300.field_2._M_allocated_capacity = *psVar7;
          local_300._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_300._M_string_length = puVar4[1];
        *puVar4 = psVar7;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
        local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
          local_2b0.GeneratorName.field_2._8_8_ = plVar6[3];
        }
        else {
          local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar7;
          local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2b0.GeneratorName._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (errorMessage != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)errorMessage);
        }
      }
    }
LAB_001489bb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2) {
      operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                      local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    uVar8 = local_2e0.field_2._M_allocated_capacity;
    _Var9._M_p = local_2e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
LAB_001489f8:
      operator_delete(_Var9._M_p,uVar8 + 1);
    }
  }
  bVar2 = false;
LAB_00148a02:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmServerProtocol1::DoActivate(const cmServerRequest& request,
                                   std::string* errorMessage)
{
  std::string sourceDirectory = request.Data[kSOURCE_DIRECTORY_KEY].asString();
  std::string buildDirectory = request.Data[kBUILD_DIRECTORY_KEY].asString();
  std::string generator = request.Data[kGENERATOR_KEY].asString();
  std::string extraGenerator = request.Data[kEXTRA_GENERATOR_KEY].asString();
  std::string toolset = request.Data[kTOOLSET_KEY].asString();
  std::string platform = request.Data[kPLATFORM_KEY].asString();

  // normalize source and build directory
  if (!sourceDirectory.empty()) {
    sourceDirectory = cmSystemTools::CollapseFullPath(sourceDirectory);
    cmSystemTools::ConvertToUnixSlashes(sourceDirectory);
  }
  if (!buildDirectory.empty()) {
    buildDirectory = cmSystemTools::CollapseFullPath(buildDirectory);
    cmSystemTools::ConvertToUnixSlashes(buildDirectory);
  }

  if (buildDirectory.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kBUILD_DIRECTORY_KEY +
                      "\" is missing.");
    return false;
  }

  cmake* cm = CMakeInstance();
  if (cmSystemTools::PathExists(buildDirectory)) {
    if (!cmSystemTools::FileIsDirectory(buildDirectory)) {
      setErrorMessage(errorMessage,
                      std::string("\"") + kBUILD_DIRECTORY_KEY +
                        "\" exists but is not a directory.");
      return false;
    }

    const std::string cachePath = cmake::FindCacheFile(buildDirectory);
    if (cm->LoadCache(cachePath)) {
      cmState* state = cm->GetState();

      // Check generator:
      if (!getOrTestValue(state, "CMAKE_GENERATOR", generator, "generator",
                          errorMessage)) {
        return false;
      }

      // check extra generator:
      if (!getOrTestValue(state, "CMAKE_EXTRA_GENERATOR", extraGenerator,
                          "extra generator", errorMessage)) {
        return false;
      }

      // check sourcedir:
      if (!getOrTestHomeDirectory(state, sourceDirectory, errorMessage)) {
        return false;
      }

      // check toolset:
      if (!getOrTestValue(state, "CMAKE_GENERATOR_TOOLSET", toolset, "toolset",
                          errorMessage)) {
        return false;
      }

      // check platform:
      if (!getOrTestValue(state, "CMAKE_GENERATOR_PLATFORM", platform,
                          "platform", errorMessage)) {
        return false;
      }
    }
  }

  if (sourceDirectory.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is unset but required.");
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDirectory)) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is not a directory.");
    return false;
  }
  if (generator.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kGENERATOR_KEY +
                      "\" is unset but required.");
    return false;
  }

  std::vector<cmake::GeneratorInfo> generators;
  cm->GetRegisteredGenerators(generators);
  auto baseIt = std::find_if(generators.begin(), generators.end(),
                             [&generator](const cmake::GeneratorInfo& info) {
                               return info.name == generator;
                             });
  if (baseIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("Generator \"") + generator +
                      "\" not supported.");
    return false;
  }
  auto extraIt = std::find_if(
    generators.begin(), generators.end(),
    [&generator, &extraGenerator](const cmake::GeneratorInfo& info) {
      return info.baseName == generator && info.extraName == extraGenerator;
    });
  if (extraIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("The combination of generator \"" + generator +
                                "\" and extra generator \"" + extraGenerator +
                                "\" is not supported."));
    return false;
  }
  if (!extraIt->supportsToolset && !toolset.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Toolset was provided but is not supported by "
                                "the requested generator."));
    return false;
  }
  if (!extraIt->supportsPlatform && !platform.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Platform was provided but is not supported "
                                "by the requested generator."));
    return false;
  }

  this->GeneratorInfo =
    GeneratorInformation(generator, extraGenerator, toolset, platform,
                         sourceDirectory, buildDirectory);

  this->m_State = STATE_ACTIVE;
  return true;
}